

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

vector<duckdb::Value,_true> *
duckdb::AggregateFunctionExtractor::GetParameters
          (vector<duckdb::Value,_true> *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,
          idx_t offset)

{
  size_type *psVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  char cVar7;
  ulong __val;
  long lVar8;
  string __str;
  char *local_198;
  uint local_190;
  char local_188 [16];
  _func_int **local_178;
  FunctionSet<duckdb::AggregateFunction> *local_170;
  idx_t local_168;
  AggregateFunction local_160;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_170 = &(entry->functions).super_FunctionSet<duckdb::AggregateFunction>;
  psVar1 = &local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
  __val = 0;
  local_178 = (_func_int **)&PTR__AggregateFunction_02435ff8;
  local_168 = offset;
  do {
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset(&local_160,local_170,local_168);
    lVar8 = (long)local_160.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_160.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         local_178;
    if (local_160.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
    if ((ulong)((lVar8 >> 3) * -0x5555555555555555) <= __val) {
      return __return_storage_ptr__;
    }
    cVar7 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar7 = cVar3;
        if (uVar5 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_01521cf4;
        }
        if (uVar5 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_01521cf4;
        }
        if (uVar5 < 10000) goto LAB_01521cf4;
        bVar2 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar7 + '\x04';
      } while (bVar2);
      cVar7 = cVar7 + '\x01';
    }
LAB_01521cf4:
    local_198 = local_188;
    ::std::__cxx11::string::_M_construct((ulong)&local_198,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_198,local_190,__val);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x1de3842);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length =
           *psVar6;
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2.
      _M_allocated_capacity = plVar4[3];
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)psVar1;
    }
    else {
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length =
           *psVar6;
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)*plVar4;
    }
    local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
         (pointer)plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
    if (local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (_func_int **)psVar1) {
      operator_delete(local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function);
    }
    if (local_198 != local_188) {
      operator_delete(local_198);
    }
    __val = __val + 1;
  } while( true );
}

Assistant:

static vector<Value> GetParameters(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		for (idx_t i = 0; i < entry.functions.GetFunctionByOffset(offset).arguments.size(); i++) {
			results.emplace_back("col" + to_string(i));
		}
		return results;
	}